

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,ArtifactType artifact)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  ulong uVar5;
  pointer pcVar6;
  string *psVar7;
  PolicyID id;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 *local_210;
  anon_class_24_3_c8775dd5 message;
  string local_1f0;
  cmValue local_1d0;
  cmValue implib;
  cmValue config_implib;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string impProp_1;
  string local_138;
  cmValue local_118;
  cmValue location;
  cmValue config_location;
  cmAlphaNum local_d8;
  undefined1 local_a8 [8];
  string impProp;
  string suffix;
  cmValue imp;
  cmValue loc;
  undefined1 local_48 [8];
  string desired_config;
  ArtifactType artifact_local;
  string *config_local;
  cmTarget *this_local;
  string *result;
  
  desired_config.field_2._12_4_ = artifact;
  bVar2 = IsImported(this);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_48,(string *)config);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_48,"NOCONFIG");
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    cmValue::cmValue(&imp,(nullptr_t)0x0);
    cmValue::cmValue((cmValue *)((long)&suffix.field_2 + 8),(nullptr_t)0x0);
    std::__cxx11::string::string((string *)(impProp.field_2._M_local_buf + 8));
    TVar3 = GetType(this);
    if ((TVar3 != INTERFACE_LIBRARY) &&
       (bVar2 = GetMappedConfig(this,(string *)local_48,&imp,(cmValue *)((long)&suffix.field_2 + 8),
                                (string *)((long)&impProp.field_2 + 8)), bVar2)) {
      if (desired_config.field_2._12_4_ == 0) {
        bVar2 = cmValue::operator_cast_to_bool(&imp);
        if (bVar2) {
          psVar7 = cmValue::operator*[abi_cxx11_(&imp);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_d8,"IMPORTED_LOCATION");
          cmAlphaNum::cmAlphaNum
                    ((cmAlphaNum *)&config_location,(string *)((long)&impProp.field_2 + 8));
          cmStrCat<>((string *)local_a8,&local_d8,(cmAlphaNum *)&config_location);
          location = GetProperty(this,(string *)local_a8);
          bVar2 = cmValue::operator_cast_to_bool(&location);
          if (bVar2) {
            psVar7 = cmValue::operator*[abi_cxx11_(&location);
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,"IMPORTED_LOCATION",
                       (allocator<char> *)(impProp_1.field_2._M_local_buf + 0xf));
            local_118 = GetProperty(this,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(impProp_1.field_2._M_local_buf + 0xf));
            bVar2 = cmValue::operator_cast_to_bool(&local_118);
            if (bVar2) {
              psVar7 = cmValue::operator*[abi_cxx11_(&local_118);
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
            }
          }
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      else if (desired_config.field_2._12_4_ == 1) {
        bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&suffix.field_2 + 8));
        if (bVar2) {
          psVar7 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&suffix.field_2 + 8));
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
        }
        else {
          TVar3 = GetType(this);
          if ((TVar3 == SHARED_LIBRARY) || (bVar2 = IsExecutableWithExports(this), bVar2)) {
            cmAlphaNum::cmAlphaNum(&local_190,"IMPORTED_IMPLIB");
            cmAlphaNum::cmAlphaNum
                      ((cmAlphaNum *)&config_implib,(string *)((long)&impProp.field_2 + 8));
            cmStrCat<>((string *)local_160,&local_190,(cmAlphaNum *)&config_implib);
            implib = GetProperty(this,(string *)local_160);
            bVar2 = cmValue::operator_cast_to_bool(&implib);
            if (bVar2) {
              psVar7 = cmValue::operator*[abi_cxx11_(&implib);
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f0,"IMPORTED_IMPLIB",
                         (allocator<char> *)((long)&message.this + 7));
              local_1d0 = GetProperty(this,&local_1f0);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&message.this + 7));
              bVar2 = cmValue::operator_cast_to_bool(&local_1d0);
              if (bVar2) {
                psVar7 = cmValue::operator*[abi_cxx11_(&local_1d0);
                std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
              }
            }
            std::__cxx11::string::~string((string *)local_160);
          }
        }
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      TVar3 = GetType(this);
      if (TVar3 != INTERFACE_LIBRARY) {
        local_210 = (undefined1 *)((long)&desired_config.field_2 + 0xc);
        message.artifact = (ArtifactType *)config;
        message.config = (string *)this;
        PVar4 = GetPolicyStatus(this,CMP0111);
        if (PVar4 != OLD) {
          if (PVar4 == WARN) {
            pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                     operator->(&this->impl);
            pcVar1 = pcVar6->Makefile;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_270,(cmPolicies *)0x6f,id);
            std::operator+(&local_250,&local_270,"\n");
            ImportedGetFullPath(std::__cxx11::string_const&,cmStateEnums::ArtifactType)::
            operator()[abi_cxx11_(&local_290,&local_210);
            std::operator+(&local_230,&local_250,&local_290);
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_230);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&local_270);
          }
          else {
            pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                     operator->(&this->impl);
            pcVar1 = pcVar6->Makefile;
            ImportedGetFullPath(std::__cxx11::string_const&,cmStateEnums::ArtifactType)::
            operator()[abi_cxx11_(&local_2b0,&local_210);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2b0);
            std::__cxx11::string::~string((string *)&local_2b0);
          }
        }
      }
      psVar7 = GetName_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_300,psVar7);
      cmAlphaNum::cmAlphaNum(&local_330,"-NOTFOUND");
      cmStrCat<>(&local_2d0,&local_300,&local_330);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    std::__cxx11::string::~string((string *)(impProp.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTarget.cxx"
                ,0x9fc,
                "std::string cmTarget::ImportedGetFullPath(const std::string &, cmStateEnums::ArtifactType) const"
               );
}

Assistant:

std::string cmTarget::ImportedGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string desired_config = config;
  if (config.empty()) {
    desired_config = "NOCONFIG";
  }

  std::string result;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetMappedConfig(desired_config, loc, imp, suffix)) {
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        if (loc) {
          result = *loc;
        } else {
          std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
          if (cmValue config_location = this->GetProperty(impProp)) {
            result = *config_location;
          } else if (cmValue location =
                       this->GetProperty("IMPORTED_LOCATION")) {
            result = *location;
          }
        }
        break;

      case cmStateEnums::ImportLibraryArtifact:
        if (imp) {
          result = *imp;
        } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) {
          std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
          if (cmValue config_implib = this->GetProperty(impProp)) {
            result = *config_implib;
          } else if (cmValue implib = this->GetProperty("IMPORTED_IMPLIB")) {
            result = *implib;
          }
        }
        break;
    }
  }

  if (result.empty()) {
    if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      auto message = [&]() -> std::string {
        std::string unset;
        std::string configuration;

        if (artifact == cmStateEnums::RuntimeBinaryArtifact) {
          unset = "IMPORTED_LOCATION";
        } else if (artifact == cmStateEnums::ImportLibraryArtifact) {
          unset = "IMPORTED_IMPLIB";
        }

        if (!config.empty()) {
          configuration = cmStrCat(" configuration \"", config, "\"");
        }

        return cmStrCat(unset, " not set for imported target \"",
                        this->GetName(), "\"", configuration, ".");
      };

      switch (this->GetPolicyStatus(cmPolicies::CMP0111)) {
        case cmPolicies::WARN:
          this->impl->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0111) + "\n" +
              message());
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        default:
          this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                             message());
      }
    }

    result = cmStrCat(this->GetName(), "-NOTFOUND");
  }
  return result;
}